

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
operator()(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125> *this,
          int *args)

{
  int *in_RCX;
  undefined1 local_21;
  char s [7];
  
  builtin_strncpy(s,"{0:10}",7);
  do_check_format_string<char,fmt::v5::internal::error_handler,int>((v5 *)s,6,&local_21);
  format<char[7],int>(__return_storage_ptr__,(v5 *)s,(char (*) [7])args,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }